

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_process_all_blocks(MD_CTX *ctx)

{
  char cVar1;
  long lVar2;
  uint *puVar3;
  long lVar4;
  int iVar5;
  long in_RDI;
  long in_FS_OFFSET;
  MD_BLOCK *block;
  int ret;
  int byte_off;
  anon_union_12_3_837b93b5 det;
  int local_28;
  int local_24;
  MD_BLOCK *block_00;
  uint uVar6;
  undefined4 in_stack_fffffffffffffff4;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = 0;
  local_28 = 0;
  *(undefined4 *)(in_RDI + 0x228) = 0;
  do {
    if (*(int *)(in_RDI + 0x218) <= local_24) {
      *(undefined4 *)(in_RDI + 0x218) = 0;
LAB_00a07d3c:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return local_28;
      }
      __stack_chk_fail();
    }
    puVar3 = (uint *)(*(long *)(in_RDI + 0x208) + (long)local_24);
    block_00 = (MD_BLOCK *)&DAT_aaaaaaaaaaaaaaaa;
    uVar6 = 0xaaaaaaaa;
    cVar1 = (char)*puVar3;
    if (cVar1 == '\x02') {
      block_00 = (MD_BLOCK *)
                 CONCAT35(0xaaaaaa,CONCAT14((char)(*puVar3 >> 0x10),(uint)((*puVar3 >> 8 & 4) == 0))
                         );
    }
    else if (cVar1 == '\x03') {
      block_00 = (MD_BLOCK *)(ulong)CONCAT14((*puVar3 >> 8 & 4) == 0,puVar3[1]);
      uVar6 = CONCAT31(0xaaaaaa,(char)(*puVar3 >> 0x10));
    }
    else if (cVar1 == '\x04') {
      block_00 = (MD_BLOCK *)
                 CONCAT35(0xaaaaaa,CONCAT14((char)(*puVar3 >> 0x10),(uint)(*puVar3 >> 0x10 != 0)));
      uVar6 = puVar3[1];
    }
    if ((*puVar3 >> 8 & 3) == 0) {
      local_28 = md_process_leaf_block((MD_CTX *)CONCAT44(in_stack_fffffffffffffff4,uVar6),block_00)
      ;
      if (local_28 < 0) goto LAB_00a07d3c;
      if (((*puVar3 & 0xff) == 7) || ((*puVar3 & 0xff) == 8)) {
        iVar5 = puVar3[1] * 0xc;
      }
      else {
        iVar5 = puVar3[1] * 8;
      }
      local_24 = local_24 + iVar5;
    }
    else {
      if ((*puVar3 >> 8 & 2) != 0) {
        local_28 = (**(code **)(in_RDI + 0x20))
                             (*puVar3 & 0xff,&stack0xffffffffffffffe8,*(undefined8 *)(in_RDI + 0x50)
                             );
        if (local_28 != 0) {
          if (*(long *)(in_RDI + 0x40) != 0) {
            (**(code **)(in_RDI + 0x40))
                      ("Aborted from leave_block() callback.",*(undefined8 *)(in_RDI + 0x50));
          }
          goto LAB_00a07d3c;
        }
        if ((((*puVar3 & 0xff) == 2) || ((*puVar3 & 0xff) == 3)) || ((*puVar3 & 0xff) == 1)) {
          *(int *)(in_RDI + 0x228) = *(int *)(in_RDI + 0x228) + -1;
        }
      }
      if ((*puVar3 >> 8 & 1) != 0) {
        local_28 = (**(code **)(in_RDI + 0x18))
                             (*puVar3 & 0xff,&stack0xffffffffffffffe8,*(undefined8 *)(in_RDI + 0x50)
                             );
        if (local_28 != 0) {
          if (*(long *)(in_RDI + 0x40) != 0) {
            (**(code **)(in_RDI + 0x40))
                      ("Aborted from enter_block() callback.",*(undefined8 *)(in_RDI + 0x50));
          }
          goto LAB_00a07d3c;
        }
        if (((*puVar3 & 0xff) == 2) || ((*puVar3 & 0xff) == 3)) {
          lVar4 = *(long *)(in_RDI + 0x220) + (long)*(int *)(in_RDI + 0x228) * 0x18;
          *(ushort *)(lVar4 + 1) = *(ushort *)(lVar4 + 1) & 0xff00 | (ushort)(*puVar3 >> 8) & 4;
          *(int *)(in_RDI + 0x228) = *(int *)(in_RDI + 0x228) + 1;
        }
        else if ((*puVar3 & 0xff) == 1) {
          lVar4 = *(long *)(in_RDI + 0x220) + (long)*(int *)(in_RDI + 0x228) * 0x18;
          *(ushort *)(lVar4 + 1) = *(ushort *)(lVar4 + 1) & 0xff00 | 1;
          *(int *)(in_RDI + 0x228) = *(int *)(in_RDI + 0x228) + 1;
        }
      }
    }
    local_24 = local_24 + 8;
  } while( true );
}

Assistant:

static int
md_process_all_blocks(MD_CTX* ctx)
{
    int byte_off = 0;
    int ret = 0;

    /* ctx->containers now is not needed for detection of lists and list items
     * so we reuse it for tracking what lists are loose or tight. We rely
     * on the fact the vector is large enough to hold the deepest nesting
     * level of lists. */
    ctx->n_containers = 0;

    while(byte_off < ctx->n_block_bytes) {
        MD_BLOCK* block = (MD_BLOCK*)((char*)ctx->block_bytes + byte_off);
        union {
            MD_BLOCK_UL_DETAIL ul;
            MD_BLOCK_OL_DETAIL ol;
            MD_BLOCK_LI_DETAIL li;
        } det;

        switch(block->type) {
            case MD_BLOCK_UL:
                det.ul.is_tight = (block->flags & MD_BLOCK_LOOSE_LIST) ? FALSE : TRUE;
                det.ul.mark = (CHAR) block->data;
                break;

            case MD_BLOCK_OL:
                det.ol.start = block->n_lines;
                det.ol.is_tight =  (block->flags & MD_BLOCK_LOOSE_LIST) ? FALSE : TRUE;
                det.ol.mark_delimiter = (CHAR) block->data;
                break;

            case MD_BLOCK_LI:
                det.li.is_task = (block->data != 0);
                det.li.task_mark = (CHAR) block->data;
                det.li.task_mark_offset = (OFF) block->n_lines;
                break;

            default:
                /* noop */
                break;
        }

        if(block->flags & MD_BLOCK_CONTAINER) {
            if(block->flags & MD_BLOCK_CONTAINER_CLOSER) {
                MD_LEAVE_BLOCK(block->type, &det);

                if(block->type == MD_BLOCK_UL || block->type == MD_BLOCK_OL || block->type == MD_BLOCK_QUOTE)
                    ctx->n_containers--;
            }

            if(block->flags & MD_BLOCK_CONTAINER_OPENER) {
                MD_ENTER_BLOCK(block->type, &det);

                if(block->type == MD_BLOCK_UL || block->type == MD_BLOCK_OL) {
                    ctx->containers[ctx->n_containers].is_loose = (block->flags & MD_BLOCK_LOOSE_LIST);
                    ctx->n_containers++;
                } else if(block->type == MD_BLOCK_QUOTE) {
                    /* This causes that any text in a block quote, even if
                     * nested inside a tight list item, is wrapped with
                     * <p>...</p>. */
                    ctx->containers[ctx->n_containers].is_loose = TRUE;
                    ctx->n_containers++;
                }
            }
        } else {
            MD_CHECK(md_process_leaf_block(ctx, block));

            if(block->type == MD_BLOCK_CODE || block->type == MD_BLOCK_HTML)
                byte_off += block->n_lines * sizeof(MD_VERBATIMLINE);
            else
                byte_off += block->n_lines * sizeof(MD_LINE);
        }

        byte_off += sizeof(MD_BLOCK);
    }

    ctx->n_block_bytes = 0;

abort:
    return ret;
}